

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void smooth_filter_stats(FIRSTPASS_STATS *stats,int start_idx,int last_idx,double *filt_intra_err,
                        double *filt_coded_err)

{
  int iVar1;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int idx_1;
  double total_wt_1;
  int idx;
  double total_wt;
  int j;
  int i;
  double *filt_coded_err_local;
  double *filt_intra_err_local;
  int last_idx_local;
  int start_idx_local;
  FIRSTPASS_STATS *stats_local;
  
  for (i = start_idx; iVar1 = start_idx, i <= last_idx; i = i + 1) {
    total_wt = 0.0;
    for (j = -3; j < 4; j = j + 1) {
      local_48 = start_idx;
      if (start_idx < i + j) {
        local_48 = i + j;
      }
      local_50 = last_idx;
      if (local_48 < last_idx) {
        local_4c = start_idx;
        if (start_idx < i + j) {
          local_4c = i + j;
        }
        local_50 = local_4c;
      }
      if (stats[local_50].is_flash == 0) {
        filt_intra_err[i] =
             smooth_filter_stats::smooth_filt[j + 3] * stats[local_50].intra_error +
             filt_intra_err[i];
        total_wt = smooth_filter_stats::smooth_filt[j + 3] + total_wt;
      }
    }
    if (total_wt <= 0.01) {
      filt_intra_err[i] = stats[i].intra_error;
    }
    else {
      filt_intra_err[i] = filt_intra_err[i] / total_wt;
    }
  }
  while (i = iVar1, i <= last_idx) {
    total_wt_1 = 0.0;
    for (j = -3; j < 4; j = j + 1) {
      local_54 = start_idx;
      if (start_idx < i + j) {
        local_54 = i + j;
      }
      local_5c = last_idx;
      if (local_54 < last_idx) {
        local_58 = start_idx;
        if (start_idx < i + j) {
          local_58 = i + j;
        }
        local_5c = local_58;
      }
      if ((stats[local_5c].is_flash == 0) &&
         ((local_5c < 1 || (stats[local_5c + -1].is_flash == 0)))) {
        filt_coded_err[i] =
             smooth_filter_stats::smooth_filt[j + 3] * stats[local_5c].coded_error +
             filt_coded_err[i];
        total_wt_1 = smooth_filter_stats::smooth_filt[j + 3] + total_wt_1;
      }
    }
    if (total_wt_1 <= 0.01) {
      filt_coded_err[i] = stats[i].coded_error;
    }
    else {
      filt_coded_err[i] = filt_coded_err[i] / total_wt_1;
    }
    iVar1 = i + 1;
  }
  return;
}

Assistant:

static void smooth_filter_stats(const FIRSTPASS_STATS *stats, int start_idx,
                                int last_idx, double *filt_intra_err,
                                double *filt_coded_err) {
  // A 7-tap gaussian smooth filter
  static const double smooth_filt[SMOOTH_FILT_LEN] = { 0.006, 0.061, 0.242,
                                                       0.383, 0.242, 0.061,
                                                       0.006 };
  int i, j;
  for (i = start_idx; i <= last_idx; i++) {
    double total_wt = 0;
    for (j = -HALF_FILT_LEN; j <= HALF_FILT_LEN; j++) {
      int idx = AOMMIN(AOMMAX(i + j, start_idx), last_idx);
      if (stats[idx].is_flash) continue;

      filt_intra_err[i] +=
          smooth_filt[j + HALF_FILT_LEN] * stats[idx].intra_error;
      total_wt += smooth_filt[j + HALF_FILT_LEN];
    }
    if (total_wt > 0.01) {
      filt_intra_err[i] /= total_wt;
    } else {
      filt_intra_err[i] = stats[i].intra_error;
    }
  }
  for (i = start_idx; i <= last_idx; i++) {
    double total_wt = 0;
    for (j = -HALF_FILT_LEN; j <= HALF_FILT_LEN; j++) {
      int idx = AOMMIN(AOMMAX(i + j, start_idx), last_idx);
      // Coded error involves idx and idx - 1.
      if (stats[idx].is_flash || (idx > 0 && stats[idx - 1].is_flash)) continue;

      filt_coded_err[i] +=
          smooth_filt[j + HALF_FILT_LEN] * stats[idx].coded_error;
      total_wt += smooth_filt[j + HALF_FILT_LEN];
    }
    if (total_wt > 0.01) {
      filt_coded_err[i] /= total_wt;
    } else {
      filt_coded_err[i] = stats[i].coded_error;
    }
  }
}